

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O2

void __thiscall MetaSim::Simulation::run(Simulation *this,Tick endTick,int nRuns)

{
  bool bVar1;
  ostream *poVar2;
  Tick TVar3;
  ulong uVar4;
  char *pcVar5;
  
  bVar1 = -2 < nRuns;
  if (nRuns < -1) {
    pcVar5 = "Initialize stats";
LAB_0011fa3c:
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar2);
    this->numRuns = 1;
    nRuns = 1;
  }
  else {
    if (nRuns == -1) {
      pcVar5 = "Will not initialize stats";
      bVar1 = false;
LAB_0011fa79:
      poVar2 = std::operator<<((ostream *)&std::cout,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar2);
      this->numRuns = 1;
      goto LAB_0011fa95;
    }
    if (nRuns == 1) {
      pcVar5 = "One single run";
      goto LAB_0011fa3c;
    }
    if (nRuns == 0) {
      bVar1 = true;
      pcVar5 = "Last Sim in the batch";
      goto LAB_0011fa79;
    }
    this->numRuns = (ulong)(uint)nRuns;
    bVar1 = true;
    if (nRuns == 2) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Warning: Simulation cannot be initialized with 2 runs");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"         Executing 3 runs!");
      std::endl<char,std::char_traits<char>>(poVar2);
      this->numRuns = 3;
      nRuns = 3;
    }
  }
  initRuns(this,nRuns);
LAB_0011fa95:
  uVar4 = 0;
  while (this->actRuns = uVar4, uVar4 < this->numRuns) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\n Run #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    initSingleRun(this);
    TVar3.v = (this->globTime).v;
    while (TVar3.v < endTick.v) {
      TVar3 = sim_step(this);
      (this->globTime).v = TVar3.v;
    }
    endSingleRun(this);
    uVar4 = this->actRuns + 1;
  }
  this->end = true;
  if (!bVar1) {
    return;
  }
  BaseStat::endSim();
  return;
}

Assistant:

void Simulation::run(Tick endTick, int nRuns) 
    {
        DBGENTER(_SIMUL_DBG_LEV);
        bool initializeRuns = true;
        bool terminateSim = true;
	
        if (nRuns < -1) {
            cout << "Initialize stats" << endl;
            initializeRuns = true;
            terminateSim = false;
            numRuns = 1;
            nRuns = -nRuns;
        }
        else if (nRuns == -1) {
            cout << "Will not initialize stats" << endl;
            initializeRuns = false;
            terminateSim = false;
            numRuns = 1;
        }
        else if (nRuns == 0) {
            cout << "Last Sim in the batch" << endl;
            initializeRuns = false;
            terminateSim = true;
            numRuns = 1;	    
        }
        else if (nRuns == 1) {
            cout << "One single run" << endl;
            initializeRuns = true;
            terminateSim = true; 
            numRuns = 1;	    
        }
        else numRuns = nRuns;

        if (numRuns == 2) {
            cout << "Warning: Simulation cannot be "
                "initialized with 2 runs" << endl;
            cout << "         Executing 3 runs!" << endl;
            numRuns = 3;
        }

        if (initializeRuns) initRuns(numRuns);

        // Ok, now starts the main cycle of the simulation.
        // remember that actRuns is the actual run number
        // while numRuns is the maximum number of runs.
        actRuns = 0;
        while (actRuns < numRuns) {
            cout << "\n Run #" << actRuns << endl;

            initSingleRun();

            // MAIN CYCLE!!
            try {
                while (globTime < endTick) {
                    globTime = sim_step();
                }
            } catch (NoMoreEventsInQueue &e) {
                cerr << "No more events in queue: simulation time =" 
                     << globTime << endl;
            }

            endSingleRun();
                                
            actRuns++;   // next run....
        }
        end = true;
        if (terminateSim) endSim();      // the simulation is over!!
    }